

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,StringTree *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,
          ArrayPtr<const_char> *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,ArrayPtr<const_char> *params_19,
          ArrayPtr<const_char> *params_20,ArrayPtr<const_char> *params_21,
          ArrayPtr<const_char> *params_22,CappedArray<char,_26UL> *params_23,
          ArrayPtr<const_char> *params_24,CappedArray<char,_26UL> *params_25,
          ArrayPtr<const_char> *params_26)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  CappedArray<char,_26UL> *pCVar4;
  char *pos;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_7;
  ArrayPtr<const_char> *rest_8;
  StringTree *rest_9;
  ArrayPtr<const_char> *rest_10;
  StringTree *rest_11;
  ArrayPtr<const_char> *rest_12;
  ArrayPtr<const_char> *rest_13;
  ArrayPtr<const_char> *rest_14;
  ArrayPtr<const_char> *rest_15;
  ArrayPtr<const_char> *rest_16;
  ArrayPtr<const_char> *rest_17;
  ArrayPtr<const_char> *rest_18;
  ArrayPtr<const_char> *rest_19;
  ArrayPtr<const_char> *rest_20;
  ArrayPtr<const_char> *rest_21;
  ArrayPtr<const_char> *rest_23;
  CappedArray<char,_26UL> *rest_24;
  ArrayPtr<const_char> *rest_25;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_360;
  size_t local_358;
  size_t local_350;
  size_t local_348;
  size_t local_340;
  size_t local_338;
  size_t local_330;
  size_t local_328;
  size_t local_320;
  size_t local_318;
  size_t local_310;
  size_t local_308;
  size_t local_300;
  size_t local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  size_t local_290;
  _ *local_288;
  undefined8 local_280;
  Array<kj::StringTree::Branch> local_278;
  size_t local_260;
  size_t local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  size_t local_218;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  _ *local_188;
  undefined8 local_180;
  String local_178;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  StringTree *local_60;
  StringTree *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = (StringTree *)params_3;
  params_local_4 = (StringTree *)params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_150 = ArrayPtr<const_char>::size(params_local_1);
  local_148 = ArrayPtr<const_char>::size(params_local_2);
  local_140 = ArrayPtr<const_char>::size(params_local_3);
  local_138 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_4);
  local_130 = size(local_60);
  local_128 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_4);
  local_120 = ArrayPtr<const_char>::size(params_5);
  local_118 = ArrayPtr<const_char>::size(params_6);
  local_110 = ArrayPtr<const_char>::size(params_7);
  local_108 = ArrayPtr<const_char>::size(params_8);
  local_100 = size((StringTree *)params_9);
  local_f8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_10);
  local_f0 = size((StringTree *)params_11);
  local_e8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_12);
  local_e0 = ArrayPtr<const_char>::size(params_13);
  local_d8 = ArrayPtr<const_char>::size(params_14);
  local_d0 = ArrayPtr<const_char>::size(params_15);
  local_c8 = ArrayPtr<const_char>::size(params_16);
  local_c0 = ArrayPtr<const_char>::size(params_17);
  local_b8 = ArrayPtr<const_char>::size(params_18);
  local_b0 = ArrayPtr<const_char>::size(params_19);
  local_a8 = ArrayPtr<const_char>::size(params_20);
  local_a0 = ArrayPtr<const_char>::size(params_21);
  local_98 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)params_22);
  local_90 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_23);
  local_88 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)params_24);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_25);
  local_78 = (_ *)&local_150;
  local_70 = 0x1b;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1b;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_260 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_258 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_250 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_248 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(local_60);
  local_240 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_238 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_230 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_228 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_220 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_218 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_9);
  local_210 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  local_208 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_11);
  local_200 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  local_1f8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_1f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_1e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_1e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_1d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_1d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_18);
  local_1c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_19);
  local_1c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_20);
  local_1b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_21);
  local_1b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_22);
  local_1a8 = flatSize<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_23);
  local_1a0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_24);
  local_198 = flatSize<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_25);
  local_190 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_188 = (_ *)&local_260;
  local_180 = 0x1b;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x1b;
  sVar1 = _::sum(local_188,nums_00);
  heapString(&local_178,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_178);
  String::~String(&local_178);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_360 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_358 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_350 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_348 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(local_60);
  local_340 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_338 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_330 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_328 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_320 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_318 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_9);
  local_310 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  local_308 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_11);
  local_300 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  local_2f8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_2f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_2e8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_2e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_2d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_2d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_18);
  local_2c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_19);
  local_2c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_20);
  local_2b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_21);
  local_2b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_22);
  local_2a8 = branchCount<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_23);
  local_2a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_24);
  local_298 = branchCount<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_25);
  local_290 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_288 = (_ *)&local_360;
  local_280 = 0x1b;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x1b;
  sVar1 = _::sum(local_288,nums_01);
  heapArray<kj::StringTree::Branch>(&local_278,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_278);
  Array<kj::StringTree::Branch>::~Array(&local_278);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  pSVar3 = fwd<kj::StringTree>(local_60);
  rest_4 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>(params_8);
  rest_9 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_9);
  rest_10 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_10);
  rest_11 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_11);
  rest_12 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_12);
  rest_13 = fwd<kj::ArrayPtr<char_const>>(params_13);
  rest_14 = fwd<kj::ArrayPtr<char_const>>(params_14);
  rest_15 = fwd<kj::ArrayPtr<char_const>>(params_15);
  rest_16 = fwd<kj::ArrayPtr<char_const>>(params_16);
  rest_17 = fwd<kj::ArrayPtr<char_const>>(params_17);
  rest_18 = fwd<kj::ArrayPtr<char_const>>(params_18);
  rest_19 = fwd<kj::ArrayPtr<char_const>>(params_19);
  rest_20 = fwd<kj::ArrayPtr<char_const>>(params_20);
  rest_21 = fwd<kj::ArrayPtr<char_const>>(params_21);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_22);
  rest_23 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_23);
  rest_24 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_24);
  rest_25 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_25);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,rest,rest_1,rest_2,pSVar3,rest_4,rest_5,rest_6,
             rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,
             rest_18,rest_19,rest_20,rest_21,pCVar4,rest_23,rest_24,rest_25);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}